

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

void __thiscall sznet::net::TcpConnection::sendInLoop(TcpConnection *this,void *data,size_t len)

{
  uint64_t *puVar1;
  EventLoop *this_00;
  Channel *pCVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  sz_ssize_t sVar7;
  undefined8 *puVar8;
  size_t len_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar9;
  ulong uVar10;
  SourceFile file;
  _Any_data local_1068;
  undefined1 local_1058 [16];
  ulong local_1048;
  undefined8 uStack_1040;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1038;
  char *local_b8 [4];
  _Any_data local_98;
  code *local_88;
  Functor local_78;
  void *local_58;
  sz_ssize_t local_50;
  EventLoop *local_48;
  undefined1 local_40 [16];
  
  this_00 = this->m_loop;
  bVar5 = EventLoop::isInLoopThread(this_00);
  if (!bVar5) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  if (this->m_state == kDisconnected) {
    file._8_8_ = 0x11;
    file.m_data = "TcpConnection.cpp";
    Logger::Logger((Logger *)&local_1068,file,0x7a,WARN);
    if (0x1d < (uint)((int)local_b8 - (int)local_b8[0])) {
      builtin_strncpy(local_b8[0],"disconnected, give up writing",0x1d);
      local_b8[0] = local_b8[0] + 0x1d;
    }
    Logger::~Logger((Logger *)&local_1068);
    return;
  }
  pCVar2 = (this->m_channel)._M_t.
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  bVar5 = true;
  bVar9 = true;
  if (((pCVar2->m_events & 8) == 0) &&
     ((this->m_outputBuffer).m_writerIndex == (this->m_outputBuffer).m_readerIndex)) {
    sVar7 = sockets::sz_socket_write(pCVar2->m_fd,data,len);
    if (-1 < sVar7) {
      puVar1 = &(this->m_netStatInfo).m_sendBytes;
      *puVar1 = *puVar1 + sVar7;
      len_00 = len - sVar7;
      if (len - sVar7 == 0) {
        if ((this->m_writeCompleteCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
          len_00 = 0;
        }
        else {
          local_48 = this->m_loop;
          local_50 = sVar7;
          std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<sznet::net::TcpConnection,void>
                    ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)local_40,
                     (__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
          std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::function
                    ((function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)
                     &local_1068,&this->m_writeCompleteCallback);
          local_1048 = local_40._0_8_;
          uStack_1040 = local_40._8_8_;
          local_40 = ZEXT816(0) << 0x20;
          std::function<void()>::
          function<std::_Bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>(std::shared_ptr<sznet::net::TcpConnection>)>,void>
                    ((function<void()> *)local_98._M_pod_data,
                     (_Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_(std::shared_ptr<sznet::net::TcpConnection>)>
                      *)&local_1068);
          EventLoop::queueInLoop(local_48,(Functor *)&local_98);
          if (local_88 != (code *)0x0) {
            (*local_88)(&local_98,&local_98,__destroy_functor);
          }
          std::
          _Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_(std::shared_ptr<sznet::net::TcpConnection>)>
          ::~_Bind((_Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_(std::shared_ptr<sznet::net::TcpConnection>)>
                    *)&local_1068);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
          }
          sVar7 = local_50;
          len_00 = 0;
        }
      }
      goto LAB_0012fc21;
    }
    iVar6 = sz_getlasterr();
    if (iVar6 != 4) {
      bVar5 = sockets::sz_wouldblock();
    }
  }
  bVar9 = bVar5;
  sVar7 = 0;
  len_00 = len;
LAB_0012fc21:
  if (len_00 <= len) {
    if (bVar9 == true && len_00 != 0) {
      uVar10 = (this->m_outputBuffer).m_writerIndex - (this->m_outputBuffer).m_readerIndex;
      if (((uVar10 < this->m_highWaterMark) &&
          (uVar10 = uVar10 + len_00, this->m_highWaterMark <= uVar10)) &&
         ((this->m_highWaterMarkCallback).super__Function_base._M_manager != (_Manager_type)0x0)) {
        local_48 = this->m_loop;
        local_58 = data;
        local_50 = sVar7;
        std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<sznet::net::TcpConnection,void>
                  ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)local_40,
                   (__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
        std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_unsigned_long)>::
        function((function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_unsigned_long)>
                  *)&local_1068,&this->m_highWaterMarkCallback);
        uVar3 = local_40._0_8_;
        uVar4 = local_40._8_8_;
        uStack_1040 = local_40._0_8_;
        local_1038 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_;
        local_40 = ZEXT816(0);
        local_78 = (Functor)(ZEXT432(0) << 0x40);
        local_1048 = uVar10;
        puVar8 = (undefined8 *)operator_new(0x38);
        *puVar8 = 0;
        puVar8[1] = 0;
        puVar8[2] = 0;
        puVar8[3] = local_1058._8_8_;
        if (local_1058._0_8_ != 0) {
          *puVar8 = local_1068._M_unused._M_object;
          puVar8[1] = local_1068._8_8_;
          puVar8[2] = local_1058._0_8_;
          local_1058 = ZEXT816(0) << 0x20;
        }
        puVar8[4] = uVar10;
        puVar8[5] = uVar3;
        puVar8[6] = 0;
        local_1038 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        puVar8[6] = uVar4;
        uStack_1040 = 0;
        local_78.super__Function_base._M_functor._M_unused._M_object = puVar8;
        local_78.super__Function_base._M_manager =
             std::
             _Function_handler<void_(),_std::_Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_unsigned_long)>_(std::shared_ptr<sznet::net::TcpConnection>,_unsigned_long)>_>
             ::_M_manager;
        local_78._M_invoker =
             std::
             _Function_handler<void_(),_std::_Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_unsigned_long)>_(std::shared_ptr<sznet::net::TcpConnection>,_unsigned_long)>_>
             ::_M_invoke;
        EventLoop::queueInLoop(local_48,&local_78);
        data = local_58;
        if (local_78.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_78.super__Function_base._M_manager)
                    ((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
        }
        if (local_1038 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1038);
        }
        if ((code *)local_1058._0_8_ != (code *)0x0) {
          (*(code *)local_1058._0_8_)(&local_1068,&local_1068,__destroy_functor);
        }
        sVar7 = local_50;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
          sVar7 = local_50;
        }
      }
      Buffer::ensureWritableBytes(&this->m_outputBuffer,len_00);
      memcpy((this->m_outputBuffer).m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl
             .super__Vector_impl_data._M_start + (this->m_outputBuffer).m_writerIndex,
             (void *)((long)data + sVar7),len_00);
      Buffer::hasWritten(&this->m_outputBuffer,len_00);
      pCVar2 = (this->m_channel)._M_t.
               super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
               ._M_t.
               super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
               .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
      if ((pCVar2->m_events & 8) == 0) {
        pCVar2->m_events = pCVar2->m_events | 8;
        Channel::update(pCVar2);
      }
    }
    return;
  }
  __assert_fail("remaining <= len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                ,0x97,"void sznet::net::TcpConnection::sendInLoop(const void *, size_t)");
}

Assistant:

void TcpConnection::sendInLoop(const void* data, size_t len)
{
	m_loop->assertInLoopThread();
	// �ѷ�����
	sz_ssize_t nwrote = 0;
	// ʣ������
	size_t remaining = len;
	// ��������
	bool faultError = false;

	if (m_state == kDisconnected)
	{
		LOG_WARN << "disconnected, give up writing";
		return;
	}

	// û�����ÿ�д�¼� && ���ͻ�����û�����ݣ�����������������
	if (!m_channel->isWriting() && m_outputBuffer.readableBytes() == 0)
	{
		nwrote = sockets::sz_socket_write(m_channel->fd(), data, len);
		if (nwrote >= 0)
		{
			m_netStatInfo.m_sendBytes += nwrote;
			remaining = len - nwrote;
			if (remaining == 0 && m_writeCompleteCallback)
			{
				m_loop->queueInLoop(std::bind(m_writeCompleteCallback, shared_from_this()));
			}
		}
		// nwrote < 0
		else
		{
			nwrote = 0;
			if (sz_getlasterr() != sz_err_eintr && !sockets::sz_wouldblock())
			{
				faultError = true;
			}
		}
	}
	
	// ȫ��������/���˲���/û����ȥ/������
	assert(remaining <= len);
	if (!faultError && remaining > 0)
	{
		size_t oldLen = m_outputBuffer.readableBytes();
		// �������ݻ�����û�г�����ˮλ�ߣ����Ҵ�����������������ʧ�ܣ����뻺�����󳬹���ˮλ�ߺ����лص�
		if (oldLen + remaining >= m_highWaterMark && oldLen < m_highWaterMark && m_highWaterMarkCallback)
		{
			m_loop->queueInLoop(std::bind(m_highWaterMarkCallback, shared_from_this(), oldLen + remaining));
		}
		m_outputBuffer.append(static_cast<const char*>(data) + nwrote, remaining);
		// ע����д�¼�
		if (!m_channel->isWriting())
		{
			m_channel->enableWriting();
		}
	}
}